

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t do_ats_write(CPUARMState_conflict *env,uint64_t value,MMUAccessType access_type,
                     ARMMMUIdx mmu_idx)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint32_t fsr_2;
  uint32_t fsr_1;
  uint32_t uStack_84;
  _Bool take_exc;
  uint32_t fsc;
  uint32_t fsr;
  uint32_t syn;
  int target_el;
  int current_el;
  ARMCacheAttrs cacheattrs;
  ARMMMUFaultInfo_conflict1 fi;
  MemTxAttrs attrs;
  _Bool format64;
  uint64_t par64;
  _Bool ret;
  target_ulong tStack_38;
  int prot;
  target_ulong page_size;
  hwaddr phys_addr;
  ARMMMUIdx mmu_idx_local;
  MMUAccessType access_type_local;
  uint64_t value_local;
  CPUARMState_conflict *env_local;
  
  fi._31_1_ = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_1_ = 0;
  phys_addr._0_4_ = mmu_idx;
  phys_addr._4_4_ = access_type;
  _mmu_idx_local = value;
  value_local = (uint64_t)env;
  memset(&current_el,0,0x20);
  target_el = 0;
  par64._3_1_ = get_phys_addr_aarch64
                          ((CPUARMState_conflict *)value_local,_mmu_idx_local,phys_addr._4_4_,
                           (ARMMMUIdx)phys_addr,&page_size,(MemTxAttrs *)&fi.stage2,
                           (int *)((long)&par64 + 4),&stack0xffffffffffffffc8,
                           (ARMMMUFaultInfo_conflict1 *)&current_el,(ARMCacheAttrs *)&target_el);
  if ((bool)par64._3_1_) {
    uVar3 = arm_current_el((CPUARMState_conflict *)value_local);
    bVar1 = false;
    if (((((fi.level._1_1_ & 1) == 0) || (uVar3 != 1)) ||
        (_Var2 = arm_is_secure((CPUARMState_conflict *)value_local), _Var2)) ||
       (_Var2 = arm_mmu_idx_is_stage1_of_2((ARMMMUIdx)phys_addr), !_Var2)) {
      if (current_el == 9) {
        if (((byte)fi.level & 1) == 0) {
          fsr = exception_target_el((CPUARMState_conflict *)value_local);
        }
        else if (uVar3 == 3) {
          fsr = 3;
        }
        else {
          fsr = 2;
        }
        bVar1 = true;
      }
    }
    else {
      if ((current_el == 9) && ((*(ulong *)(value_local + 0x3c0) & 8) != 0)) {
        fsr = 3;
      }
      else {
        uVar5 = extract64(fi._0_8_,0xc,0x2f);
        *(uint64_t *)(value_local + 0x438) = uVar5 << 4;
        fsr = 2;
      }
      bVar1 = true;
    }
    if (bVar1) {
      if (((fsr == 2) || (_Var2 = arm_el_is_aa64((CPUARMState_conflict *)value_local,fsr), _Var2))
         || (_Var2 = arm_s1_regime_using_lpae_format_aarch64
                               ((CPUARMState_conflict *)value_local,(ARMMMUIdx)phys_addr), _Var2)) {
        uStack_84 = arm_fi_to_lfsc((ARMMMUFaultInfo_conflict1 *)&current_el);
        fsr_1 = extract32(uStack_84,0,6);
      }
      else {
        uStack_84 = arm_fi_to_sfsc((ARMMMUFaultInfo_conflict1 *)&current_el);
        fsr_1 = 0x3f;
      }
      uVar3 = syn_data_abort_no_iss
                        ((uint)(uVar3 == fsr),(uint)(fi.level._2_1_ & 1),1,
                         (uint)(fi.level._1_1_ & 1),1,fsr_1);
      *(uint64_t *)(value_local + 0xbd8) = _mmu_idx_local;
      *(uint32_t *)(value_local + 0xbd4) = uStack_84;
      raise_exception_aarch64((CPUARMState_conflict *)value_local,4,uVar3,fsr);
    }
  }
  _Var2 = is_a64((CPUARMState_conflict *)value_local);
  if (_Var2) {
    fi._31_1_ = 1;
  }
  else {
    iVar4 = arm_feature((CPUARMState_conflict *)value_local,0x1a);
    if (iVar4 != 0) {
      fi._31_1_ = arm_s1_regime_using_lpae_format_aarch64
                            ((CPUARMState_conflict *)value_local,(ARMMMUIdx)phys_addr);
      iVar4 = arm_feature((CPUARMState_conflict *)value_local,0x20);
      if (iVar4 != 0) {
        if ((((ARMMMUIdx)phys_addr == ARMMMUIdx_E10_0) || ((ARMMMUIdx)phys_addr == ARMMMUIdx_E10_1))
           || ((ARMMMUIdx)phys_addr == ARMMMUIdx_E10_1_PAN)) {
          fi._31_1_ = (fi._31_1_ & 1) != 0 || (*(ulong *)(value_local + 0x3b8) & 0x1001) != 0;
        }
        else {
          iVar4 = arm_current_el((CPUARMState_conflict *)value_local);
          fi._31_1_ = (fi._31_1_ & 1) != 0 || iVar4 == 2;
        }
      }
    }
  }
  if ((fi._31_1_ & 1) == 0) {
    if ((par64._3_1_ & 1) == 0) {
      if ((tStack_38 == 0x1000000) &&
         (iVar4 = arm_feature((CPUARMState_conflict *)value_local,5), iVar4 != 0)) {
        _attrs = page_size & 0xff000000 | 2;
      }
      else {
        _attrs = page_size & 0xfffff000;
      }
      if (((uint)fi._24_4_ >> 1 & 1) == 0) {
        _attrs = _attrs | 0x200;
      }
    }
    else {
      uVar3 = arm_fi_to_sfsc((ARMMMUFaultInfo_conflict1 *)&current_el);
      _attrs = (ulong)((uVar3 & 0x400) >> 5 | (uVar3 & 0x1000) >> 6 | (uVar3 & 0xf) << 1 | 1);
    }
  }
  else if ((par64._3_1_ & 1) == 0) {
    _attrs = page_size & 0xfffffffffffff000 | 0x800;
    if (((uint)fi._24_4_ >> 1 & 1) == 0) {
      _attrs = page_size & 0xfffffffffffff000 | 0xa00;
    }
    _attrs = (long)(int)((uint)((ushort)target_el >> 8 & 3) << 7) |
             (ulong)((ushort)target_el & 0xff) << 0x38 | _attrs;
  }
  else {
    uVar3 = arm_fi_to_lfsc((ARMMMUFaultInfo_conflict1 *)&current_el);
    uVar6 = (ulong)((uVar3 & 0x3f) << 1);
    _attrs = uVar6 | 0x801;
    if (((byte)fi.level & 1) != 0) {
      _attrs = uVar6 | 0xa01;
    }
    if ((fi.level._1_1_ & 1) != 0) {
      _attrs = _attrs | 0x100;
    }
  }
  return _attrs;
}

Assistant:

static uint64_t do_ats_write(CPUARMState *env, uint64_t value,
                             MMUAccessType access_type, ARMMMUIdx mmu_idx)
{
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    uint64_t par64;
    bool format64 = false;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };
    ARMCacheAttrs cacheattrs = { 0 };

    ret = get_phys_addr(env, value, access_type, mmu_idx, &phys_addr, &attrs,
                        &prot, &page_size, &fi, &cacheattrs);

    if (ret) {
        /*
         * Some kinds of translation fault must cause exceptions rather
         * than being reported in the PAR.
         */
        int current_el = arm_current_el(env);
        int target_el;
        uint32_t syn, fsr, fsc;
        bool take_exc = false;

        if (fi.s1ptw && current_el == 1 && !arm_is_secure(env)
            && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
            /*
             * Synchronous stage 2 fault on an access made as part of the
             * translation table walk for AT S1E0* or AT S1E1* insn
             * executed from NS EL1. If this is a synchronous external abort
             * and SCR_EL3.EA == 1, then we take a synchronous external abort
             * to EL3. Otherwise the fault is taken as an exception to EL2,
             * and HPFAR_EL2 holds the faulting IPA.
             */
            if (fi.type == ARMFault_SyncExternalOnWalk &&
                (env->cp15.scr_el3 & SCR_EA)) {
                target_el = 3;
            } else {
                env->cp15.hpfar_el2 = extract64(fi.s2addr, 12, 47) << 4;
                target_el = 2;
            }
            take_exc = true;
        } else if (fi.type == ARMFault_SyncExternalOnWalk) {
            /*
             * Synchronous external aborts during a translation table walk
             * are taken as Data Abort exceptions.
             */
            if (fi.stage2) {
                if (current_el == 3) {
                    target_el = 3;
                } else {
                    target_el = 2;
                }
            } else {
                target_el = exception_target_el(env);
            }
            take_exc = true;
        }

        if (take_exc) {
            /* Construct FSR and FSC using same logic as arm_deliver_fault() */
            if (target_el == 2 || arm_el_is_aa64(env, target_el) ||
                arm_s1_regime_using_lpae_format(env, mmu_idx)) {
                fsr = arm_fi_to_lfsc(&fi);
                fsc = extract32(fsr, 0, 6);
            } else {
                fsr = arm_fi_to_sfsc(&fi);
                fsc = 0x3f;
            }
            /*
             * Report exception with ESR indicating a fault due to a
             * translation table walk for a cache maintenance instruction.
             */
            syn = syn_data_abort_no_iss(current_el == target_el,
                                        fi.ea, 1, fi.s1ptw, 1, fsc);
            env->exception.vaddress = value;
            env->exception.fsr = fsr;
            raise_exception(env, EXCP_DATA_ABORT, syn, target_el);
        }
    }

    if (is_a64(env)) {
        format64 = true;
    } else if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /*
         * ATS1Cxx:
         * * TTBCR.EAE determines whether the result is returned using the
         *   32-bit or the 64-bit PAR format
         * * Instructions executed in Hyp mode always use the 64bit format
         *
         * ATS1S2NSOxx uses the 64bit format if any of the following is true:
         * * The Non-secure TTBCR.EAE bit is set to 1
         * * The implementation includes EL2, and the value of HCR.VM is 1
         *
         * (Note that HCR.DC makes HCR.VM behave as if it is 1.)
         *
         * ATS1Hx always uses the 64bit format.
         */
        format64 = arm_s1_regime_using_lpae_format(env, mmu_idx);

        if (arm_feature(env, ARM_FEATURE_EL2)) {
            if (mmu_idx == ARMMMUIdx_E10_0 ||
                mmu_idx == ARMMMUIdx_E10_1 ||
                mmu_idx == ARMMMUIdx_E10_1_PAN) {
                format64 |= env->cp15.hcr_el2 & (HCR_VM | HCR_DC);
            } else {
                format64 |= arm_current_el(env) == 2;
            }
        }
    }

    if (format64) {
        /* Create a 64-bit PAR */
        par64 = (1 << 11); /* LPAE bit always set */
        if (!ret) {
            par64 |= phys_addr & ~0xfffULL;
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
            par64 |= (uint64_t)cacheattrs.attrs << 56; /* ATTR */
            par64 |= cacheattrs.shareability << 7; /* SH */
        } else {
            uint32_t fsr = arm_fi_to_lfsc(&fi);

            par64 |= 1; /* F */
            par64 |= (fsr & 0x3f) << 1; /* FS */
            if (fi.stage2) {
                par64 |= (1 << 9); /* S */
            }
            if (fi.s1ptw) {
                par64 |= (1 << 8); /* PTW */
            }
        }
    } else {
        /* fsr is a DFSR/IFSR value for the short descriptor
         * translation table format (with WnR always clear).
         * Convert it to a 32-bit PAR.
         */
        if (!ret) {
            /* We do not set any attribute bits in the PAR */
            if (page_size == (1 << 24)
                && arm_feature(env, ARM_FEATURE_V7)) {
                par64 = (phys_addr & 0xff000000) | (1 << 1);
            } else {
                par64 = phys_addr & 0xfffff000;
            }
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
        } else {
            uint32_t fsr = arm_fi_to_sfsc(&fi);

            par64 = ((fsr & (1 << 10)) >> 5) | ((fsr & (1 << 12)) >> 6) |
                    ((fsr & 0xf) << 1) | 1;
        }
    }
    return par64;
}